

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O1

size_t MULTICLASS::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  char *in_RAX;
  size_t sVar1;
  size_t sVar2;
  char *c;
  char *local_18;
  
  sVar2 = 8;
  local_18 = in_RAX;
  sVar1 = io_buf::buf_read(cache,&local_18,8);
  if (sVar1 < 8) {
    sVar2 = 0;
  }
  else {
    *(undefined4 *)v = *(undefined4 *)local_18;
    *(undefined4 *)((long)v + 4) = *(undefined4 *)(local_18 + 4);
  }
  return sVar2;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  label_t* ld = (label_t*)v;
  char* c;
  size_t total = sizeof(ld->label) + sizeof(ld->weight);
  if (cache.buf_read(c, total) < total)
    return 0;
  bufread_label(ld, c);

  return total;
}